

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pure.cpp
# Opt level: O3

string * fs_with_suffix_abi_cxx11_(string_view path,string_view new_suffix)

{
  string_view path_00;
  path *this;
  size_t in_RCX;
  char *in_RDX;
  size_t unaff_RBX;
  size_t in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_R8;
  char *unaff_R12;
  string_view path_01;
  string_view other;
  string stem;
  allocator<char> local_c1;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  long *local_a0;
  long local_98;
  long local_90 [2];
  path local_80;
  path local_58;
  
  path_00._M_str = unaff_R12;
  path_00._M_len = unaff_RBX;
  fs_stem_abi_cxx11_(path_00);
  if (local_98 == 0) {
    path_01._M_str = in_RDX;
    path_01._M_len = in_RSI;
    other._M_str = in_R8;
    other._M_len = in_RCX;
    fs_join_abi_cxx11_(in_RDI,path_01,other);
  }
  else {
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (&local_58,&local_b0,auto_format);
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (&local_80,&local_c0,auto_format);
    this = (path *)std::filesystem::__cxx11::path::replace_extension(&local_58);
    std::filesystem::__cxx11::path::generic_string<char,std::char_traits<char>,std::allocator<char>>
              (in_RDI,this,&local_c1);
    std::filesystem::__cxx11::path::~path(&local_80);
    std::filesystem::__cxx11::path::~path(&local_58);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  return in_RDI;
}

Assistant:

std::string fs_with_suffix(std::string_view path, std::string_view new_suffix)
{
  const std::string stem = fs_stem(path);
  // handle directory case: stem is empty
  if(stem.empty())
    return fs_join(path, new_suffix);

#ifdef HAVE_CXX_FILESYSTEM
  return std::filesystem::path(path).replace_extension(new_suffix).generic_string();
#else
  const std::string p = fs_parent(path);

  const std::string r = (p == ".") ? stem : p + "/" + stem;

  return r + std::string(new_suffix);

#endif
}